

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

int process_global_unset(archive_read *a,mtree_option **global,char *line)

{
  int iVar1;
  char *__s;
  char *pcVar2;
  size_t sVar3;
  mtree_option **__s_00;
  mtree_option *head;
  long in_RDX;
  undefined8 *in_RSI;
  archive *in_RDI;
  size_t len;
  char *next;
  mtree_option **global_00;
  int local_4;
  
  __s = (char *)(in_RDX + 6);
  pcVar2 = strchr(__s,0x3d);
  if (pcVar2 == (char *)0x0) {
    while( true ) {
      sVar3 = strspn(__s," \t\r\n");
      __s_00 = (mtree_option **)(__s + sVar3);
      if (*(char *)__s_00 == '\0') break;
      global_00 = __s_00;
      head = (mtree_option *)strcspn((char *)__s_00," \t\r\n");
      if ((head == (mtree_option *)0x3) && (iVar1 = strncmp((char *)global_00,"all",3), iVar1 == 0))
      {
        free_options(head);
        *in_RSI = 0;
      }
      else {
        remove_option(global_00,(char *)__s_00,(size_t)head);
      }
      __s = (char *)((long)&head->next + (long)global_00);
    }
    local_4 = 0;
  }
  else {
    archive_set_error(in_RDI,-1,"/unset shall not contain `=\'");
    local_4 = -0x1e;
  }
  return local_4;
}

Assistant:

static int
process_global_unset(struct archive_read *a,
    struct mtree_option **global, const char *line)
{
	const char *next;
	size_t len;

	line += 6;
	if (strchr(line, '=') != NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "/unset shall not contain `='");
		return ARCHIVE_FATAL;
	}

	for (;;) {
		next = line + strspn(line, " \t\r\n");
		if (*next == '\0')
			return (ARCHIVE_OK);
		line = next;
		len = strcspn(line, " \t\r\n");

		if (len == 3 && strncmp(line, "all", 3) == 0) {
			free_options(*global);
			*global = NULL;
		} else {
			remove_option(global, line, len);
		}

		line += len;
	}
}